

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::String::_opHex(String *this,ModifyOp op,void *data,size_t size,char separator)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  Error EVar4;
  
  if (size == 0) {
    EVar4 = 0;
  }
  else {
    EVar4 = 1;
    if (separator == '\0') {
      if (size < 0x7fffffffffffffff) {
        pcVar1 = prepare(this,op,size * 2);
        if (pcVar1 != (char *)0x0) {
          EVar4 = 0;
          for (sVar3 = 0; size != sVar3; sVar3 = sVar3 + 1) {
            pcVar1[sVar3 * 2] = "0123456789ABCDEF"[*(byte *)((long)data + sVar3) >> 4];
            pcVar1[sVar3 * 2 + 1] = "0123456789ABCDEF"[*(byte *)((long)data + sVar3) & 0xf];
          }
        }
      }
    }
    else if (size < 0x5555555555555555) {
      pcVar1 = prepare(this,op,size * 3 - 1);
      if (pcVar1 != (char *)0x0) {
        EVar4 = 0;
        lVar2 = 0;
        while( true ) {
          *pcVar1 = "0123456789ABCDEF"[*(byte *)((long)data + lVar2) >> 4];
          pcVar1[1] = "0123456789ABCDEF"[*(byte *)((long)data + lVar2) & 0xf];
          if (size - 1 == lVar2) break;
          pcVar1[2] = separator;
          pcVar1 = pcVar1 + 3;
          lVar2 = lVar2 + 1;
        }
      }
    }
  }
  return EVar4;
}

Assistant:

Error String::_opHex(ModifyOp op, const void* data, size_t size, char separator) noexcept {
  char* dst;
  const uint8_t* src = static_cast<const uint8_t*>(data);

  if (!size)
    return kErrorOk;

  if (separator) {
    if (ASMJIT_UNLIKELY(size >= SIZE_MAX / 3))
      return DebugUtils::errored(kErrorOutOfMemory);

    dst = prepare(op, size * 3 - 1);
    if (ASMJIT_UNLIKELY(!dst))
      return DebugUtils::errored(kErrorOutOfMemory);

    size_t i = 0;
    for (;;) {
      dst[0] = String_baseN[(src[0] >> 4) & 0xF];
      dst[1] = String_baseN[(src[0]     ) & 0xF];
      if (++i == size)
        break;
      // This makes sure that the separator is only put between two hexadecimal bytes.
      dst[2] = separator;
      dst += 3;
      src++;
    }
  }
  else {
    if (ASMJIT_UNLIKELY(size >= SIZE_MAX / 2))
      return DebugUtils::errored(kErrorOutOfMemory);

    dst = prepare(op, size * 2);
    if (ASMJIT_UNLIKELY(!dst))
      return DebugUtils::errored(kErrorOutOfMemory);

    for (size_t i = 0; i < size; i++, dst += 2, src++) {
      dst[0] = String_baseN[(src[0] >> 4) & 0xF];
      dst[1] = String_baseN[(src[0]     ) & 0xF];
    }
  }

  return kErrorOk;
}